

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>>
::
Intrusive_list_column<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>>,Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>>,Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>>>>>>>
          (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>>
           *this,Index columnIndex,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *nonZeroRowIndices,Dimension dimension
          ,vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>_>_>
           *rowContainer,Column_settings *colSettings)

{
  ID_index rowIndex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  bool bVar1;
  uint pivot;
  reference puVar2;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
  local_68;
  const_iterator cStack_58;
  ID_index id;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  Column_settings *local_38;
  Column_settings *colSettings_local;
  vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>_>_>
  *rowContainer_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_20;
  Dimension dimension_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *nonZeroRowIndices_local;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true>>>
  *pIStack_10;
  Index columnIndex_local;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>
  *this_local;
  
  local_38 = colSettings;
  colSettings_local = (Column_settings *)rowContainer;
  rowContainer_local._4_4_ = dimension;
  pvStack_20 = nonZeroRowIndices;
  nonZeroRowIndices_local._4_4_ = columnIndex;
  pIStack_10 = this;
  Row_access<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>
  ::Row_access((Row_access<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>
                *)this,columnIndex,rowContainer);
  Column_dimension_holder<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>
  ::Column_dimension_holder
            ((Column_dimension_holder<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>
              *)(this + 0x10),rowContainer_local._4_4_);
  __range4 = pvStack_20;
  pivot = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>
          ::
          Intrusive_list_column<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>_>_>_>_>_>
          ::anon_class_8_1_c18eeb02::operator()((anon_class_8_1_c18eeb02 *)&__range4);
  Dummy_chain_properties::Dummy_chain_properties((Dummy_chain_properties *)this,pivot,0);
  *(undefined8 *)(this + 0x18) = 0;
  *(Column_settings **)(this + 0x20) = local_38;
  boost::intrusive::
  list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
  ::list((list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
          *)(this + 0x28));
  this_00 = pvStack_20;
  __end0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvStack_20);
  cStack_58 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffa8);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end0);
    rowIndex = *puVar2;
    local_68.data_.root_plus_size_.m_header.super_node.prev_._4_4_ = rowIndex;
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
    ::end(&local_68);
    Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>
    ::_insert_entry((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true>_>_>
                     *)this,rowIndex,(iterator *)&local_68);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

inline Intrusive_list_column<Master_matrix>::Intrusive_list_column(Index columnIndex,
                                                                   const Container& nonZeroRowIndices,
                                                                   Dimension dimension,
                                                                   Row_container* rowContainer,
                                                                   Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(dimension),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor)),
      column_()
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _insert_entry(id, column_.end());
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _insert_entry(operators_->get_value(p.second), p.first, column_.end());
    }
  }
}